

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Subtract_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Var pvVar4;
  Var aValue;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  Type TVar7;
  double value;
  Type TStack_40;
  
  pvVar4 = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aLeft,scriptContext);
  aValue = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aRight,scriptContext);
  if (pvVar4 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00992b80;
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(pvVar4);
  if (bVar2) {
    TVar7 = TypeIds_FirstNumberType;
  }
  else if ((ulong)pvVar4 >> 0x32 == 0) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(pvVar4);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00992b80;
      *puVar5 = 0;
    }
    TVar7 = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)TVar7) && (BVar3 = RecyclableObject::IsExternal(pRVar6), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00992b80;
      *puVar5 = 0;
    }
  }
  else {
    TVar7 = TypeIds_Number;
  }
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00992b80;
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    TStack_40 = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)aValue >> 0x32 != 0) {
      TStack_40 = TypeIds_Number;
      goto LAB_00992b33;
    }
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00992b80;
      *puVar5 = 0;
    }
    TStack_40 = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)TStack_40) && (BVar3 = RecyclableObject::IsExternal(pRVar6), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00992b80:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
LAB_00992b33:
  if ((TVar7 != TypeIds_BigInt) && (TStack_40 != TypeIds_BigInt)) {
    value = Subtract_Helper(pvVar4,aValue,scriptContext);
    pvVar4 = JavascriptNumber::ToVarIntCheck(value,scriptContext);
    return pvVar4;
  }
  if (TStack_40 != TVar7) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fff3,L"Subtract BigInt");
  }
  pvVar4 = JavascriptBigInt::Sub(pvVar4,aValue);
  return pvVar4;
}

Assistant:

Var JavascriptMath::Subtract_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Subtract_Full);

            Var aLeftToPrim = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aLeft, scriptContext);
            Var aRightToPrim = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);

            Js::TypeId typeLeft = JavascriptOperators::GetTypeId(aLeftToPrim);
            Js::TypeId typeRight = JavascriptOperators::GetTypeId(aRightToPrim);

            if (typeLeft == TypeIds_BigInt || typeRight == TypeIds_BigInt)
            {
                if (typeRight != typeLeft)
                {
                    JavascriptError::ThrowTypeError(scriptContext, VBSERR_TypeMismatch, _u("Subtract BigInt"));
                }
                return JavascriptBigInt::Sub(aLeftToPrim, aRightToPrim);
            }

            double difference = Subtract_Helper(aLeftToPrim, aRightToPrim, scriptContext);
            return JavascriptNumber::ToVarIntCheck(difference, scriptContext);
            JIT_HELPER_END(Op_Subtract_Full);
        }